

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O2

void __thiscall
OctreeBuilder::CmdBuild(OctreeBuilder *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  CommandBuffer *pCVar1;
  OctreeBuilder *pOVar2;
  uint uVar3;
  initializer_list<VkBufferCopy> __l;
  initializer_list<VkBufferCopy> __l_00;
  initializer_list<VkBufferMemoryBarrier> __l_01;
  initializer_list<VkBufferMemoryBarrier> __l_02;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l_03;
  initializer_list<VkBufferMemoryBarrier> __l_04;
  initializer_list<VkBufferMemoryBarrier> __l_05;
  initializer_list<VkBufferMemoryBarrier> __l_06;
  initializer_list<VkBufferMemoryBarrier> __l_07;
  initializer_list<VkBufferMemoryBarrier> __l_08;
  allocator_type local_f9;
  VkBufferCopy local_f8;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_d8;
  _Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_c0;
  OctreeBuilder *local_a8;
  __shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  VkBufferMemoryBarrier local_98;
  uint32_t local_5c;
  shared_ptr<myvk::Buffer> *local_58;
  __shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *local_50;
  __shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             &(this->m_build_info_staging_buffer).
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = &this->m_build_info_buffer;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             &local_58->super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  local_f8.srcOffset = 0;
  local_f8.dstOffset = 0;
  local_f8.size =
       (((this->m_build_info_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_BufferBase).m_size;
  __l._M_len = 1;
  __l._M_array = &local_f8;
  local_a8 = this;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_98,__l,&local_f9);
  myvk::CommandBuffer::CmdCopy
            (pCVar1,(Ptr<BufferBase> *)&local_c0,(Ptr<BufferBase> *)&local_d8,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_98);
  std::_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~_Vector_base
            ((_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_d8._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_c0._M_impl.super__Vector_impl_data._M_finish);
  pOVar2 = local_a8;
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             &(local_a8->m_indirect_staging_buffer).
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  local_a0 = &(pOVar2->m_indirect_buffer).
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_d8,local_a0);
  local_f8.srcOffset = 0;
  local_f8.dstOffset = 0;
  local_f8.size =
       (((pOVar2->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_BufferBase).m_size;
  __l_00._M_len = 1;
  __l_00._M_array = &local_f8;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_98,__l_00,&local_f9);
  myvk::CommandBuffer::CmdCopy
            (pCVar1,(Ptr<BufferBase> *)&local_c0,(Ptr<BufferBase> *)&local_d8,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_98);
  std::_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~_Vector_base
            ((_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_d8._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_c0._M_impl.super__Vector_impl_data._M_finish);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_f8.srcOffset = 0;
  local_f8.dstOffset = 0;
  local_f8.size = 0;
  myvk::BufferBase::GetMemoryBarrier
            (&local_98,
             &((local_58->super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_BufferBase,0x1000,0x60,0xffffffff,0xffffffff);
  __l_01._M_len = 1;
  __l_01._M_array = &local_98;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
             __l_01,(allocator_type *)&local_f9);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            (pCVar1,0x1000,0x800,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_c0);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_f8.srcOffset = 0;
  local_f8.dstOffset = 0;
  local_f8.size = 0;
  myvk::BufferBase::GetMemoryBarrier
            (&local_98,
             &((__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_a0->_M_ptr)->_M_ptr
              ->super_BufferBase,0x1000,0x41,0xffffffff,0xffffffff);
  __l_02._M_len = 1;
  __l_02._M_array = &local_98;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
             __l_02,(allocator_type *)&local_f9);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            (pCVar1,0x1000,0x802,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_c0);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
  pOVar2 = local_a8;
  uVar3 = ((local_a8->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->m_voxel_fragment_count;
  local_5c = ((uVar3 >> 6) + 1) - (uint)((uVar3 & 0x3f) == 0);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             &(local_a8->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_c0;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)&local_98,__l_03,(allocator_type *)&local_d8);
  local_f8.srcOffset = 0;
  local_f8.dstOffset = 0;
  local_f8.size = 0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            (pCVar1,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                     *)&local_98,&pOVar2->m_pipeline_layout,VK_PIPELINE_BIND_POINT_COMPUTE,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_c0._M_impl.super__Vector_impl_data._M_finish);
  local_38 = &(pOVar2->m_init_node_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
  local_40 = &(pOVar2->m_tag_node_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
  local_48 = &(pOVar2->m_alloc_node_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
  local_50 = &(pOVar2->m_modify_arg_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
  for (uVar3 = 1;
      uVar3 <= ((pOVar2->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_level; uVar3 = uVar3 + 1) {
    pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<myvk::ComputePipeline,void>
              ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_98,local_38);
    myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pNext);
    pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
              ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_98,local_a0);
    myvk::CommandBuffer::CmdDispatchIndirect(pCVar1,(Ptr<BufferBase> *)&local_98,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pNext);
    pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_f8.srcOffset = 0;
    local_f8.dstOffset = 0;
    local_f8.size = 0;
    myvk::BufferBase::GetMemoryBarrier
              (&local_98,
               &((local_a8->m_octree_buffer).
                 super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_BufferBase,0x40,0x60,0xffffffff,0xffffffff);
    __l_04._M_len = 1;
    __l_04._M_array = &local_98;
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
              ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
               __l_04,(allocator_type *)&local_f9);
    local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    myvk::CommandBuffer::CmdPipelineBarrier
              (pCVar1,0x800,0x800,
               (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
               (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
               (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
    std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
              (&local_d8);
    std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
              (&local_c0);
    std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
              ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
    pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<myvk::ComputePipeline,void>
              ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_98,local_40);
    myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pNext);
    myvk::CommandBuffer::CmdDispatch
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,local_5c,1,1);
    if (uVar3 != ((local_a8->m_voxelizer_ptr).
                  super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_level) {
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_f8.srcOffset = 0;
      local_f8.dstOffset = 0;
      local_f8.size = 0;
      myvk::BufferBase::GetMemoryBarrier
                (&local_98,
                 &((local_a8->m_octree_buffer).
                   super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_BufferBase,0x40,0x60,0xffffffff,0xffffffff);
      __l_05._M_len = 1;
      __l_05._M_array = &local_98;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 __l_05,(allocator_type *)&local_f9);
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      myvk::CommandBuffer::CmdPipelineBarrier
                (pCVar1,0x800,0x800,
                 (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d8);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base(&local_c0);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<myvk::ComputePipeline,void>
                ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_98,local_48);
      myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pNext);
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<myvk::Buffer,void>
                ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_98,local_a0);
      myvk::CommandBuffer::CmdDispatchIndirect(pCVar1,(Ptr<BufferBase> *)&local_98,0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pNext);
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_f8.srcOffset = 0;
      local_f8.dstOffset = 0;
      local_f8.size = 0;
      myvk::BufferBase::GetMemoryBarrier
                (&local_98,
                 &((local_a8->m_octree_buffer).
                   super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_BufferBase,0x40,0x60,0xffffffff,0xffffffff);
      __l_06._M_len = 1;
      __l_06._M_array = &local_98;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 __l_06,(allocator_type *)&local_f9);
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      myvk::CommandBuffer::CmdPipelineBarrier
                (pCVar1,0x800,0x800,
                 (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d8);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base(&local_c0);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<myvk::ComputePipeline,void>
                ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_98,local_50);
      myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pNext);
      myvk::CommandBuffer::CmdDispatch
                ((command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,1,1,1);
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_f8.srcOffset = 0;
      local_f8.dstOffset = 0;
      local_f8.size = 0;
      myvk::BufferBase::GetMemoryBarrier
                (&local_98,
                 &((__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_a0->_M_ptr)->
                  _M_ptr->super_BufferBase,0x40,0x41,0xffffffff,0xffffffff);
      __l_07._M_len = 1;
      __l_07._M_array = &local_98;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 __l_07,(allocator_type *)&local_f9);
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      myvk::CommandBuffer::CmdPipelineBarrier
                (pCVar1,0x800,0x802,
                 (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d8);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base(&local_c0);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
      pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_f8.srcOffset = 0;
      local_f8.dstOffset = 0;
      local_f8.size = 0;
      myvk::BufferBase::GetMemoryBarrier
                (&local_98,
                 &((local_58->super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_BufferBase,0x40,0x20,0xffffffff,0xffffffff);
      __l_08._M_len = 1;
      __l_08._M_array = &local_98;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 __l_08,(allocator_type *)&local_f9);
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      myvk::CommandBuffer::CmdPipelineBarrier
                (pCVar1,0x800,0x800,
                 (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_c0,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d8);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base(&local_c0);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_f8);
    }
    pOVar2 = local_a8;
  }
  return;
}

Assistant:

void OctreeBuilder::CmdBuild(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) const {
	// transfers
	{
		command_buffer->CmdCopy(m_build_info_staging_buffer, m_build_info_buffer,
		                        {{0, 0, m_build_info_buffer->GetSize()}});
		command_buffer->CmdCopy(m_indirect_staging_buffer, m_indirect_buffer, {{0, 0, m_indirect_buffer->GetSize()}});

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
		    {m_build_info_buffer->GetMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT,
		                                           VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT | VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
		    {},
		    {m_indirect_buffer->GetMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT,
		                                         VK_ACCESS_INDIRECT_COMMAND_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});
	}

	uint32_t fragment_group_x = group_x_64(m_voxelizer_ptr->GetVoxelFragmentCount());

	command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline_layout, VK_PIPELINE_BIND_POINT_COMPUTE, {});

	for (uint32_t i = 1; i <= m_voxelizer_ptr->GetLevel(); ++i) {
		command_buffer->CmdBindPipeline(m_init_node_pipeline);
		command_buffer->CmdDispatchIndirect(m_indirect_buffer);

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
		    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
		                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});

		command_buffer->CmdBindPipeline(m_tag_node_pipeline);
		command_buffer->CmdDispatch(fragment_group_x, 1, 1);

		if (i != m_voxelizer_ptr->GetLevel()) {
			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});

			command_buffer->CmdBindPipeline(m_alloc_node_pipeline);
			command_buffer->CmdDispatchIndirect(m_indirect_buffer);

			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});

			command_buffer->CmdBindPipeline(m_modify_arg_pipeline);
			command_buffer->CmdDispatch(1, 1, 1);

			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
			    VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT | VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_indirect_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                         VK_ACCESS_INDIRECT_COMMAND_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});
			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_build_info_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT)}, {});
		}
	}
}